

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

int Socket(void)

{
  uint __fd;
  int iVar1;
  void *__dest;
  size_t __n;
  undefined4 uVar2;
  char *__s;
  sockaddr_in address;
  sockaddr local_18;
  
  __s = (char *)0x2;
  uVar2 = 1;
  __fd = socket(2,1,0);
  if (__fd == 0) {
    Socket_cold_3();
  }
  else {
    local_18.sa_family = 2;
    local_18.sa_data[2] = '\0';
    local_18.sa_data[3] = '\0';
    local_18.sa_data[4] = '\0';
    local_18.sa_data[5] = '\0';
    local_18.sa_data._0_2_ = (ushort)SERVER_PORT << 8 | (ushort)SERVER_PORT >> 8;
    local_18.sa_data[6] = '\0';
    local_18.sa_data[7] = '\0';
    local_18.sa_data[8] = '\0';
    local_18.sa_data[9] = '\0';
    local_18.sa_data[10] = '\0';
    local_18.sa_data[0xb] = '\0';
    local_18.sa_data[0xc] = '\0';
    local_18.sa_data[0xd] = '\0';
    __s = (char *)(ulong)__fd;
    uVar2 = (int)&local_18;
    iVar1 = bind(__fd,&local_18,0x10);
    if (-1 < iVar1) {
      __s = (char *)(ulong)__fd;
      uVar2 = 10;
      iVar1 = listen(__fd,10);
      if (-1 < iVar1) {
        return __fd;
      }
      goto LAB_001027e0;
    }
  }
  Socket_cold_2();
LAB_001027e0:
  Socket_cold_1();
  __dest = malloc(0x3f0);
  *(undefined4 *)((long)__dest + 1000) = uVar2;
  __n = strlen(__s);
  memcpy(__dest,__s,__n);
  iVar1 = array_list_add(reqs,__dest);
  *(int *)((long)__dest + 0x3ec) = iVar1;
  return iVar1;
}

Assistant:

int Socket() {

    struct sockaddr_in address;
    int server_fd;

    if ((server_fd = socket(AF_INET, SOCK_STREAM, 0)) == 0) {
        perror("In socket");
        exit(EXIT_FAILURE);
    }

    address.sin_family = AF_INET;
    address.sin_addr.s_addr = INADDR_ANY;
    address.sin_port = htons(SERVER_PORT);

    memset(address.sin_zero, '\0', sizeof address.sin_zero);


    if (bind(server_fd, (struct sockaddr *) &address, sizeof(address)) < 0) {
        perror("In bind");
        exit(EXIT_FAILURE);
    }

    if (listen(server_fd, 10) < 0) {
        perror("In listen");
        exit(EXIT_FAILURE);
    }

    return server_fd;
}